

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

wchar_t feat_order(wchar_t feat)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  _Var1 = flag_has_dbg(f_info[feat].flags,4,0x15,"f_info[feat].flags","TF_SHOP");
  wVar2 = L'\x06';
  if (!_Var1) {
    _Var1 = flag_has_dbg(f_info[feat].flags,4,0x1a,"f_info[feat].flags","TF_STAIR");
    wVar2 = L'\x02';
    if (!_Var1) {
      _Var1 = flag_has_dbg(f_info[feat].flags,4,0x13,"f_info[feat].flags","TF_DOOR_ANY");
      wVar2 = L'\x01';
      if (!_Var1) {
        _Var1 = flag_has_dbg(f_info[feat].flags,4,0x18,"f_info[feat].flags","TF_MAGMA");
        wVar2 = L'\x04';
        if (!_Var1) {
          _Var1 = flag_has_dbg(f_info[feat].flags,4,0x19,"f_info[feat].flags","TF_QUARTZ");
          if (!_Var1) {
            _Var1 = flag_has_dbg(f_info[feat].flags,4,0x10,"f_info[feat].flags","TF_WALL");
            wVar2 = L'\x03';
            if (!_Var1) {
              _Var1 = flag_has_dbg(f_info[feat].flags,4,0x11,"f_info[feat].flags","TF_ROCK");
              wVar2 = L'\x05';
              if (!_Var1) {
                _Var1 = flag_has_dbg(f_info[feat].flags,4,3,"f_info[feat].flags","TF_PASSABLE");
                wVar2 = L'\a';
                if (_Var1) {
                  wVar2 = L'\0';
                }
              }
            }
          }
        }
      }
    }
  }
  return wVar2;
}

Assistant:

static int feat_order(int feat)
{
	if (tf_has(f_info[feat].flags, TF_SHOP)) return 6;
	if (tf_has(f_info[feat].flags, TF_STAIR)) return 2;
	if (tf_has(f_info[feat].flags, TF_DOOR_ANY)) return 1;
	/* These also have WALL set so check them first before checking WALL. */
	if (tf_has(f_info[feat].flags, TF_MAGMA)
		|| tf_has(f_info[feat].flags, TF_QUARTZ)) return 4;
	/* These also have ROCK set so check them first before checking ROCK. */
	if (tf_has(f_info[feat].flags, TF_WALL)) return 3;
	if (tf_has(f_info[feat].flags, TF_ROCK)) return 5;
	/* Many above have PASSABLE so do this last. */
	if (tf_has(f_info[feat].flags, TF_PASSABLE)) return 0;
	return 7;
}